

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O0

void xercesc_4_0::XMLString::replaceWS(XMLCh *toConvert,MemoryManager *param_2)

{
  XMLCh *local_20;
  XMLCh *cursorPtr;
  MemoryManager *param_1_local;
  XMLCh *toConvert_local;
  
  if ((toConvert != (XMLCh *)0x0) && (local_20 = toConvert, *toConvert != L'\0')) {
    for (; *local_20 != L'\0'; local_20 = local_20 + 1) {
      if (((*local_20 == L'\r') || (*local_20 == L'\n')) || (*local_20 == L'\t')) {
        *local_20 = L' ';
      }
    }
  }
  return;
}

Assistant:

void XMLString::replaceWS(XMLCh* toConvert, MemoryManager* const)
{
    // If no string, then its a OK
    if (( !toConvert ) || ( !*toConvert ))
        return;

    XMLCh* cursorPtr = toConvert;
    while ( *cursorPtr )
    {
        if ( ( *cursorPtr == chCR) ||
             ( *cursorPtr == chLF) ||
             ( *cursorPtr == chHTab))
            *cursorPtr = chSpace;

        cursorPtr++;
    }
}